

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_columns.cpp
# Opt level: O1

void __thiscall
duckdb::BaseColumnPruner::AddBinding(BaseColumnPruner *this,BoundColumnRefExpression *col)

{
  pointer *pprVar1;
  iterator iVar2;
  long lVar3;
  long lVar4;
  iterator iVar5;
  mapped_type *this_00;
  long lVar6;
  reference_wrapper<duckdb::BoundColumnRefExpression> local_28;
  
  iVar5 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->column_references)._M_h,&col->binding);
  local_28._M_data = col;
  if (iVar5.
      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_00 = ::std::__detail::
              _Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->column_references,&col->binding);
    iVar2._M_current =
         (this_00->bindings).
         super_vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this_00->bindings).
        super_vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::BoundColumnRefExpression>>
                ((vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
                  *)this_00,iVar2,&local_28);
    }
    else {
      (iVar2._M_current)->_M_data = col;
      pprVar1 = &(this_00->bindings).
                 super_vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::BoundColumnRefExpression>,_std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
  }
  else {
    iVar2._M_current =
         *(reference_wrapper<duckdb::BoundColumnRefExpression> **)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                 ._M_cur + 0x20);
    if (iVar2._M_current ==
        *(reference_wrapper<duckdb::BoundColumnRefExpression> **)
         ((long)iVar5.
                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                ._M_cur + 0x28)) {
      ::std::
      vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::BoundColumnRefExpression>>
                ((vector<std::reference_wrapper<duckdb::BoundColumnRefExpression>,std::allocator<std::reference_wrapper<duckdb::BoundColumnRefExpression>>>
                  *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                           ._M_cur + 0x18),iVar2,&local_28);
    }
    else {
      (iVar2._M_current)->_M_data = col;
      *(long *)((long)iVar5.
                      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                      ._M_cur + 0x20) =
           *(long *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                           ._M_cur + 0x20) + 8;
    }
    lVar3 = *(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                            ._M_cur + 0x30);
    lVar4 = *(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                            ._M_cur + 0x38);
    lVar6 = lVar3;
    if (lVar4 != lVar3) {
      do {
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)(lVar6 + 8))
        ;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != lVar4);
      *(long *)((long)iVar5.
                      super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_true>
                      ._M_cur + 0x38) = lVar3;
    }
  }
  return;
}

Assistant:

void BaseColumnPruner::AddBinding(BoundColumnRefExpression &col) {
	auto entry = column_references.find(col.binding);
	if (entry == column_references.end()) {
		// column not referenced yet - add a binding to it entirely
		column_references[col.binding].bindings.push_back(col);
	} else {
		// column reference already exists - add the binding and clear any sub-references
		auto &column = entry->second;
		column.bindings.push_back(col);
		column.child_columns.clear();
	}
}